

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8collationiterator.cpp
# Opt level: O0

void __thiscall icu_63::FCDUTF8CollationIterator::switchToForward(FCDUTF8CollationIterator *this)

{
  int32_t iVar1;
  FCDUTF8CollationIterator *this_local;
  
  if (this->state == CHECK_BWD) {
    this->start = (this->super_UTF8CollationIterator).pos;
    if ((this->super_UTF8CollationIterator).pos == this->limit) {
      this->state = CHECK_FWD;
    }
    else {
      this->state = IN_FCD_SEGMENT;
    }
  }
  else {
    if (this->state != IN_FCD_SEGMENT) {
      iVar1 = this->limit;
      (this->super_UTF8CollationIterator).pos = iVar1;
      this->start = iVar1;
    }
    this->state = CHECK_FWD;
  }
  return;
}

Assistant:

void
FCDUTF8CollationIterator::switchToForward() {
    U_ASSERT(state == CHECK_BWD ||
             (state == IN_FCD_SEGMENT && pos == limit) ||
             (state == IN_NORMALIZED && pos == normalized.length()));
    if(state == CHECK_BWD) {
        // Turn around from backward checking.
        start = pos;
        if(pos == limit) {
            state = CHECK_FWD;  // Check forward.
        } else {  // pos < limit
            state = IN_FCD_SEGMENT;  // Stay in FCD segment.
        }
    } else {
        // Reached the end of the FCD segment.
        if(state == IN_FCD_SEGMENT) {
            // The input text segment is FCD, extend it forward.
        } else {
            // The input text segment needed to be normalized.
            // Switch to checking forward from it.
            start = pos = limit;
        }
        state = CHECK_FWD;
    }
}